

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O0

vf_profile_t * vf_profile_default(vf_profile_t *__return_storage_ptr__,uint16_t bits)

{
  double dVar1;
  double dVar2;
  vf_base_t bias;
  uint16_t exponent;
  uint16_t bits_local;
  
  if (7 < bits) {
    if (bits < 0x41) {
      dVar1 = round((double)((float)bits * 0.125));
      bias._4_2_ = vf_profile_default::exponents
                   [((long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f) - 1]
      ;
    }
    else {
      dVar1 = log((double)bits);
      dVar2 = log(2.0);
      dVar1 = round((dVar1 / dVar2) * 4.0);
      bias._4_2_ = (uint16_t)(int)(dVar1 + -13.0);
    }
    vf_profile_custom(__return_storage_ptr__,bits,bias._4_2_,
                      (1L << ((char)bias._4_2_ - 1U & 0x3f)) - 1);
    return __return_storage_ptr__;
  }
  __assert_fail("bits >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                ,0xc,"vf_profile_t vf_profile_default(const uint16_t)");
}

Assistant:

vf_profile_t vf_profile_default(const uint16_t bits) {
	assert(bits >= 8);
	static const uint16_t exponents[] = {3, 5, 7, 8, 8, 9, 10, 11};
	uint16_t exponent;
	if (bits <= 64) {
		exponent = exponents[(size_t)round((float)bits / 8) - 1];
	} else {
		// Formula for IEEE 754-1985 interchange formats:
		exponent = (uint16_t)(round(4 * (log(bits) / log(2))) - 13);
	}
	const vf_base_t bias = ((vf_base_t)1 << (exponent - 1)) - 1;
	return vf_profile_custom(bits, exponent, bias);
}